

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::ConnectionImpl
          (ConnectionImpl *this,TestVat *vat,TestVat *peerVat,StringPtr name,bool unique)

{
  bool unique_local;
  TestVat *peerVat_local;
  TestVat *vat_local;
  ConnectionImpl *this_local;
  StringPtr name_local;
  
  VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
  ::Connection::Connection(&this->super_Connection);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  kj::TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_Connection).super_Connection._vptr_Connection =
       (_func_int **)&PTR_newOutgoingMessage_00d76648;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00d76720;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00d76748;
  this->vat = vat;
  this->peerVat = peerVat;
  this->unique = unique;
  RpcDumper::Sender::Sender(&this->dumper,&vat->network->dumper,name);
  kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>::Maybe(&this->partner);
  kj::StringPtr::StringPtr(&this->partnerName);
  kj::Maybe<kj::ForkedPromise<void>_>::Maybe(&this->currentBlock);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe
            (&this->currentBlockFulfiller);
  kj::Maybe<kj::Function<bool_(capnp::rpc::Message::Reader)>_>::Maybe(&this->blockAfterPredicate);
  kj::Maybe<kj::Exception>::Maybe(&this->networkException);
  kj::ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
  ProducerConsumerQueue(&this->messageQueue);
  kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&this->fulfillOnEnd);
  this->idle = true;
  this->initiatedIdleShutdown = false;
  kj::heap<kj::TaskSet,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>
            ((kj *)&this->tasks,this);
  if (!unique) {
    kj::
    HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>
    ::insert(&vat->connections,peerVat,this);
  }
  return;
}

Assistant:

ConnectionImpl(TestVat& vat, TestVat& peerVat, kj::StringPtr name, bool unique)
        : vat(vat), peerVat(peerVat), unique(unique), dumper(vat.network.dumper, name),
          tasks(kj::heap<kj::TaskSet>(*this)) {
      if (!unique) {
        vat.connections.insert(&peerVat, this);
      }
    }